

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

double Js::JavascriptConversion::ToInteger(double val)

{
  bool bVar1;
  BOOL BVar2;
  double dVar3;
  ulong in_XMM0_Qb;
  undefined1 auVar4 [16];
  
  BVar2 = JavascriptNumber::IsNan(val);
  dVar3 = 0.0;
  if ((((val != 0.0) || (NAN(val))) && (BVar2 == 0)) &&
     ((bVar1 = JavascriptNumber::IsPosInf(val), dVar3 = val, !bVar1 &&
      (bVar1 = JavascriptNumber::IsNegInf(val), !bVar1)))) {
    auVar4._0_8_ = ABS(val);
    auVar4._8_8_ = in_XMM0_Qb & 0x7fffffffffffffff;
    auVar4 = roundsd(auVar4,auVar4,9);
    dVar3 = (double)(-(ulong)(val < 0.0) & (auVar4._0_8_ ^ 0x8000000000000000) |
                    ~-(ulong)(val < 0.0) & auVar4._0_8_);
  }
  return dVar3;
}

Assistant:

double JavascriptConversion::ToInteger(double val)
    {
        if(JavascriptNumber::IsNan(val) || JavascriptNumber::IsZero(val))
            return 0;
        if(JavascriptNumber::IsPosInf(val) || JavascriptNumber::IsNegInf(val))
        {
            return val;
        }

        return ( ((val < 0) ? -1 : 1 ) * floor(fabs(val)));
    }